

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O3

SubtreeArray ts_stack_pop_error(Stack *self,StackVersion version)

{
  uint32_t *puVar1;
  short sVar2;
  int iVar3;
  StackSlice *pSVar4;
  short *psVar5;
  uint uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  byte bVar11;
  Subtree *pSVar12;
  StackIterator *pSVar13;
  StackIterator *pSVar14;
  SubtreeHeapData *pSVar15;
  StackNode *pSVar16;
  long lVar17;
  long lVar18;
  short *psVar19;
  StackNode *pSVar20;
  uint uVar21;
  uint extraout_EDX;
  long lVar23;
  undefined8 uVar24;
  uint uVar22;
  undefined8 extraout_RDX;
  _Bool *p_Var25;
  uint uVar26;
  Subtree SVar27;
  byte *pbVar28;
  SubtreeArray *pSVar29;
  ulong uVar30;
  ulong uVar31;
  Stack *self_00;
  ulong uVar32;
  uint uVar33;
  uint32_t uVar34;
  ulong uVar35;
  undefined8 *puVar36;
  SubtreeArray SVar37;
  SubtreeArray SVar38;
  SubtreeArray SVar39;
  SubtreeArray SVar40;
  SubtreeArray subtrees;
  void *pvStack_1b0;
  ulong uStack_1a0;
  byte bStack_129;
  undefined1 auStack_100 [16];
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  ulong uStack_d8;
  ulong uStack_d0;
  StackNode *pSStack_c8;
  byte local_91;
  undefined1 local_68 [16];
  undefined8 local_58;
  undefined8 uStack_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  if ((self->heads).size <= version) {
LAB_00131321:
    __assert_fail("(uint32_t)version < (&self->heads)->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                  ,0x206,"SubtreeArray ts_stack_pop_error(Stack *, StackVersion)");
  }
  pSVar20 = (self->heads).contents[version].node;
  if (pSVar20->link_count != 0) {
    lVar23 = 0;
    do {
      uVar31 = *(ulong *)((long)&pSVar20->links[0].subtree + lVar23);
      if (((uVar31 != 0) && ((uVar31 & 1) == 0)) && (*(short *)(uVar31 + 0x28) == -1)) {
        uVar34 = 0;
        (self->slices).size = 0;
        (self->iterators).size = 0;
        pSVar12 = (Subtree *)calloc(1,8);
        if (pSVar12 == (Subtree *)0x0) {
          ts_stack_pop_error_cold_6();
          goto LAB_00131345;
        }
        if ((self->iterators).capacity == 0) {
          self_00 = (Stack *)(self->iterators).contents;
          if (self_00 == (Stack *)0x0) {
            self_00 = (Stack *)&DAT_00000008;
            uVar26 = 0x20;
            pSVar13 = (StackIterator *)calloc(8,0x20);
            if (pSVar13 == (StackIterator *)0x0) goto LAB_00131369;
            uVar34 = 0;
          }
          else {
            uVar26 = 0x100;
            pSVar13 = (StackIterator *)realloc(self_00,0x100);
            if (pSVar13 == (StackIterator *)0x0) {
              ts_stack_pop_error_cold_1();
LAB_00131369:
              ts_stack_pop_error_cold_5();
              uVar21 = 0;
              (self_00->slices).size = 0;
              (self_00->iterators).size = 0;
              pSStack_c8 = pSVar20;
              if ((self_00->heads).size <= uVar26) {
                __assert_fail("(uint32_t)version < (&self->heads)->size",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                              ,0x118,
                              "StackSliceArray stack__iter(Stack *, StackVersion, StackCallback, void *, int)"
                             );
              }
              pSVar20 = (self_00->heads).contents[uVar26].node;
              if ((self_00->iterators).capacity != 0) goto LAB_001313ef;
              pSVar13 = (self_00->iterators).contents;
              if (pSVar13 == (StackIterator *)0x0) {
                pSVar13 = (StackIterator *)&DAT_00000008;
                uVar31 = 0x20;
                pSVar14 = (StackIterator *)calloc(8,0x20);
                if (pSVar14 == (StackIterator *)0x0) goto LAB_00131792;
                uVar21 = 0;
              }
              else {
                uVar31 = 0x100;
                pSVar14 = (StackIterator *)realloc(pSVar13,0x100);
                if (pSVar14 == (StackIterator *)0x0) {
                  ts_stack_pop_all_cold_1();
LAB_00131792:
                  ts_stack_pop_all_cold_5();
                  uVar35 = uVar31 & 0xffffffff;
                  pSVar15 = (SubtreeHeapData *)calloc(1,0x10);
                  if (pSVar15 == (SubtreeHeapData *)0x0) goto LAB_00131c46;
                  uVar26 = 0;
                  pSVar13->subtree_count = 0;
                  *(undefined4 *)&pSVar13[1].subtrees.contents = 0;
                  if (*(uint *)&(pSVar13->subtrees).contents <= (uint)uVar31) goto LAB_00131c4b;
                  uVar24 = *(undefined8 *)((long)pSVar13->node->links + uVar35 * 0x28 + -0x10);
                  if (*(int *)((long)&pSVar13[1].subtrees.contents + 4) == 0) {
                    pSVar20 = pSVar13[1].node;
                    if (pSVar20 == (StackNode *)0x0) {
                      pSVar20 = (StackNode *)&DAT_00000008;
                      uVar26 = 0x20;
                      pSVar16 = (StackNode *)calloc(8,0x20);
                      if (pSVar16 == (StackNode *)0x0) goto LAB_00131c6f;
                      uVar26 = 0;
                    }
                    else {
                      uVar26 = 0x100;
                      pSVar16 = (StackNode *)realloc(pSVar20,0x100);
                      if (pSVar16 == (StackNode *)0x0) {
                        ts_stack_record_summary_cold_1();
LAB_00131c6f:
                        ts_stack_record_summary_cold_5();
                        if ((pSVar20->position).extent.row <= uVar26) {
                          __assert_fail("(uint32_t)version < (&self->heads)->size",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                                        ,0x240,
                                        "StackSummary *ts_stack_get_summary(Stack *, StackVersion)")
                          ;
                        }
                        SVar40.size = (int)extraout_RDX;
                        SVar40.capacity = (int)((ulong)extraout_RDX >> 0x20);
                        SVar40.contents =
                             *(Subtree **)(*(long *)pSVar20 + 0x10 + (ulong)uVar26 * 0x28);
                        return SVar40;
                      }
                      uVar26 = *(uint *)&pSVar13[1].subtrees.contents;
                    }
                    pSVar13[1].node = pSVar16;
                    *(undefined4 *)((long)&pSVar13[1].subtrees.contents + 4) = 8;
                  }
                  pSVar20 = pSVar13[1].node;
                  *(uint *)&pSVar13[1].subtrees.contents = uVar26 + 1;
                  lVar23 = (ulong)uVar26 * 0x20;
                  *(undefined8 *)((long)pSVar20->links + lVar23 + -0x10) = uVar24;
                  puVar36 = (undefined8 *)((long)pSVar20->links + lVar23 + -8);
                  *puVar36 = 0;
                  puVar36[1] = 0;
                  *(undefined4 *)((long)pSVar20->links + lVar23 + 8) = 0;
                  *(undefined1 *)((long)pSVar20->links + lVar23 + 0xc) = 1;
                  uVar26 = *(uint *)&pSVar13[1].subtrees.contents;
                  if (uVar26 == 0) goto LAB_00131bc8;
                  pvStack_1b0 = (void *)0x0;
                  uStack_1a0 = 0;
                  uVar31 = 0;
                  uVar21 = 0;
                  goto LAB_00131897;
                }
                uVar21 = (self_00->iterators).size;
              }
              (self_00->iterators).contents = pSVar14;
              (self_00->iterators).capacity = 8;
LAB_001313ef:
              pSVar13 = (self_00->iterators).contents;
              (self_00->iterators).size = uVar21 + 1;
              pSVar13[uVar21].node = pSVar20;
              pSVar29 = &pSVar13[uVar21].subtrees;
              pSVar29->contents = (Subtree *)0x0;
              pSVar29->size = 0;
              pSVar29->capacity = 0;
              pSVar13[uVar21].subtree_count = 0;
              pSVar13[uVar21].is_pending = true;
              uVar21 = (self_00->iterators).size;
              if (uVar21 != 0) {
                uVar31 = 0;
                do {
                  do {
                    pSVar13 = (self_00->iterators).contents;
                    pSVar20 = pSVar13[uVar31].node;
                    uVar35 = (ulong)pSVar20->link_count;
                    if (pSVar20->link_count == 0) {
                      auStack_100._0_8_ = pSVar13[uVar31].subtrees.contents;
                      pSVar12 = *(Subtree **)&pSVar13[uVar31].subtrees.size;
                      auStack_100._8_4_ = SUB84(pSVar12,0);
                      if (1 < (uint)auStack_100._8_4_) {
                        uVar33 = (uint)auStack_100._8_4_ >> 1;
                        uVar35 = 0;
                        do {
                          auStack_100._8_4_ = auStack_100._8_4_ - 1;
                          SVar27 = *(Subtree *)(auStack_100._0_8_ + uVar35 * 8);
                          *(Subtree *)(auStack_100._0_8_ + uVar35 * 8) =
                               *(Subtree *)(auStack_100._0_8_ + (ulong)(uint)auStack_100._8_4_ * 8);
                          *(Subtree *)(auStack_100._0_8_ + (ulong)(uint)auStack_100._8_4_ * 8) =
                               SVar27;
                          uVar35 = uVar35 + 1;
                        } while (uVar33 != uVar35);
                      }
                      auStack_100._8_8_ = pSVar12;
                      ts_stack__add_slice(self_00,uVar26,pSVar20,(SubtreeArray *)auStack_100);
                      uVar33 = (self_00->iterators).size;
                      if (uVar33 <= (uint)uVar31) {
LAB_0013174f:
                        __assert_fail("index < self->size",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/array.h"
                                      ,0x4f,"void array__erase(VoidArray *, size_t, uint32_t)");
                      }
                      pSVar13 = (self_00->iterators).contents;
                      memmove(pSVar13 + uVar31,pSVar13 + uVar31 + 1,
                              (ulong)(uVar33 + ~(uint)uVar31) << 5);
                      puVar1 = &(self_00->iterators).size;
                      *puVar1 = *puVar1 - 1;
                      uVar21 = uVar21 - 1;
                    }
                    else {
                      p_Var25 = &pSVar20->links[1].is_pending;
                      uVar30 = 0;
                      uStack_d0 = uVar31;
                      do {
                        uVar30 = uVar30 + 1;
                        if (uVar30 == uVar35) {
                          pSVar16 = pSVar20->links[0].node;
                          SVar27 = pSVar20->links[0].subtree;
                          bStack_129 = pSVar20->links[0].is_pending;
                          pSVar13 = (self_00->iterators).contents + uVar31;
LAB_0013155c:
                          pSVar13->node = pSVar16;
                          if (SVar27.ptr == (SubtreeHeapData *)0x0) {
                            pSVar13->subtree_count = pSVar13->subtree_count + 1;
                          }
                          else {
                            uVar33 = (pSVar13->subtrees).size;
                            if (uVar33 == (pSVar13->subtrees).capacity) {
                              uVar22 = uVar33 * 2;
                              if (uVar22 < 9) {
                                uVar22 = 8;
                              }
                              pSVar12 = (pSVar13->subtrees).contents;
                              if (uVar33 < uVar22) {
                                uVar35 = (ulong)uVar22;
                                if (pSVar12 == (Subtree *)0x0) {
                                  uStack_d8 = uVar35;
                                  pSVar12 = (Subtree *)calloc(uVar35,8);
                                  if (pSVar12 == (Subtree *)0x0) goto LAB_00131745;
                                }
                                else {
                                  pSVar12 = (Subtree *)realloc(pSVar12,uVar35 << 3);
                                  if (pSVar12 == (Subtree *)0x0) goto LAB_0013173d;
                                  uVar33 = (pSVar13->subtrees).size;
                                }
                                (pSVar13->subtrees).contents = pSVar12;
                                (pSVar13->subtrees).capacity = uVar22;
                              }
                            }
                            else {
                              pSVar12 = (pSVar13->subtrees).contents;
                            }
                            (pSVar13->subtrees).size = uVar33 + 1;
                            pSVar12[uVar33] = SVar27;
                            ts_subtree_retain(SVar27);
                            if (((ulong)SVar27.ptr & 1) == 0) {
                              uVar33 = *(uint *)&(SVar27.ptr)->field_0x2c >> 2;
                            }
                            else {
                              uVar33 = (uint)((ulong)SVar27.ptr >> 3) & 0x1fffffff;
                            }
                            if (((uVar33 & 1) != 0) ||
                               (pSVar13->subtree_count = pSVar13->subtree_count + 1,
                               (bStack_129 & 1) != 0)) goto LAB_0013162f;
                          }
                          pSVar13->is_pending = false;
                        }
                        else {
                          uVar33 = (self_00->iterators).size;
                          if (uVar33 < 0x40) {
                            pSVar16 = ((StackLink *)(p_Var25 + -0x10))->node;
                            SVar27 = *(Subtree *)(p_Var25 + -8);
                            bStack_129 = *p_Var25;
                            pSVar13 = (self_00->iterators).contents;
                            auStack_100._0_8_ = pSVar13[uVar31].node;
                            auStack_100._8_8_ = pSVar13[uVar31].subtrees.contents;
                            pSVar29 = &pSVar13[uVar31].subtrees;
                            uStack_f0._0_4_ = pSVar29->size;
                            uStack_f0._4_4_ = pSVar29->capacity;
                            uStack_e8 = pSVar29[1].contents;
                            if (uVar33 != (self_00->iterators).capacity) {
LAB_00131504:
                              (self_00->iterators).size = uVar33 + 1;
                              pSVar29 = &pSVar13[uVar33].subtrees;
                              pSVar29->size = (undefined4)uStack_f0;
                              pSVar29->capacity = uStack_f0._4_4_;
                              pSVar29[1].contents = uStack_e8;
                              pSVar13[uVar33].node = (StackNode *)auStack_100._0_8_;
                              pSVar13[uVar33].subtrees.contents = (Subtree *)auStack_100._8_8_;
                              uVar34 = (self_00->iterators).size;
                              if (uVar34 == 0) {
                                __assert_fail("(uint32_t)(&self->iterators)->size - 1 < (&self->iterators)->size"
                                              ,
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                                              ,0x151,
                                              "StackSliceArray stack__iter(Stack *, StackVersion, StackCallback, void *, int)"
                                             );
                              }
                              uVar33 = uVar34 - 1;
                              pSVar14 = (self_00->iterators).contents;
                              pSVar13 = pSVar14 + uVar33;
                              pSVar29 = &pSVar14[uVar33].subtrees;
                              ts_subtree_array_copy(*pSVar29,pSVar29);
                              goto LAB_0013155c;
                            }
                            uVar33 = uVar33 * 2;
                            if (uVar33 < 9) {
                              uVar33 = 8;
                            }
                            pSVar13 = (StackIterator *)realloc(pSVar13,(ulong)(uVar33 << 5));
                            if (pSVar13 != (StackIterator *)0x0) {
                              (self_00->iterators).contents = pSVar13;
                              (self_00->iterators).capacity = uVar33;
                              uVar33 = (self_00->iterators).size;
                              goto LAB_00131504;
                            }
                            ts_stack_pop_all_cold_2();
LAB_0013173d:
                            ts_stack_pop_all_cold_3();
LAB_00131745:
                            ts_stack_pop_all_cold_4();
                            goto LAB_0013174f;
                          }
                        }
LAB_0013162f:
                        uVar35 = (ulong)pSVar20->link_count;
                        p_Var25 = p_Var25 + 0x18;
                      } while (uVar30 < uVar35);
                      uVar31 = (ulong)((int)uStack_d0 + 1);
                    }
                  } while ((uint)uVar31 < uVar21);
                  uVar21 = (self_00->iterators).size;
                  uVar31 = 0;
                } while (uVar21 != 0);
              }
              SVar38.contents = (Subtree *)(self_00->slices).contents;
              SVar38.size = (self_00->slices).size;
              SVar38.capacity = (self_00->slices).capacity;
              return SVar38;
            }
            uVar34 = (self->iterators).size;
          }
          (self->iterators).contents = pSVar13;
          (self->iterators).capacity = 8;
        }
        pSVar13 = (self->iterators).contents;
        (self->iterators).size = uVar34 + 1;
        pSVar13[uVar34].node = pSVar20;
        pSVar13[uVar34].subtrees.contents = pSVar12;
        pSVar13[uVar34].subtrees.size = 0;
        pSVar13[uVar34].subtrees.capacity = 1;
        pSVar13[uVar34].subtree_count = 0;
        pSVar13[uVar34].is_pending = true;
        uVar26 = (self->iterators).size;
        if (uVar26 == 0) goto LAB_00131291;
        uVar35 = 0;
        uVar31 = 0;
        goto LAB_00130f7e;
      }
      lVar23 = lVar23 + 0x18;
    } while ((ulong)pSVar20->link_count * 0x18 != lVar23);
  }
  pSVar12 = (Subtree *)0x0;
  uVar24 = 0;
  goto LAB_00130e9e;
LAB_00131897:
  pSVar20 = pSVar13[1].node;
  lVar23 = (ulong)uVar21 * 0x20;
  puVar36 = (undefined8 *)((long)pSVar20->links + lVar23 + -0x10);
  uVar33 = *(uint *)((long)pSVar20->links + lVar23 + 8);
  if (extraout_EDX < uVar33) {
LAB_00131b5c:
    ts_subtree_array_delete
              ((SubtreePool *)&(pSVar13[2].subtrees.contents)->data,(SubtreeArray *)(puVar36 + 1));
    uVar33 = *(uint *)&pSVar13[1].subtrees.contents;
    if (uVar33 <= uVar21) {
LAB_00131c13:
      __assert_fail("index < self->size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/array.h"
                    ,0x4f,"void array__erase(VoidArray *, size_t, uint32_t)");
    }
    memmove((void *)((long)(pSVar13[1].node)->links + lVar23 + -0x10),
            (void *)((long)(pSVar13[1].node)->links + (ulong)uVar21 * 0x20 + 0x10),
            (ulong)(uVar33 + ~uVar21) << 5);
    *(int *)&pSVar13[1].subtrees.contents = *(int *)&pSVar13[1].subtrees.contents + -1;
    uVar26 = uVar26 - 1;
  }
  else {
    psVar5 = *(short **)((long)pSVar20->links + lVar23 + -0x10);
    sVar2 = *psVar5;
    lVar18 = uVar31 * 0x14;
    do {
      lVar17 = lVar18;
      lVar18 = lVar17 + -0x14;
      if ((lVar18 == -0x14) ||
         (uVar22 = *(uint *)((long)pvStack_1b0 + lVar17 + -8), uVar22 < uVar33)) {
        uVar22 = (uint)uStack_1a0;
        psVar19 = psVar5;
        if ((uint)uVar31 == uVar22) {
          uVar6 = uVar22 * 2;
          if (uVar22 * 2 < 9) {
            uVar6 = 8;
          }
          uVar31 = uStack_1a0;
          if (uVar22 < uVar6) {
            if (pvStack_1b0 == (void *)0x0) {
              pvStack_1b0 = calloc((ulong)uVar6,0x14);
              if (pvStack_1b0 == (void *)0x0) goto LAB_00131c3c;
            }
            else {
              pvStack_1b0 = realloc(pvStack_1b0,(ulong)uVar6 * 0x14);
              if (pvStack_1b0 == (void *)0x0) {
                ts_stack_record_summary_cold_2();
LAB_00131c3c:
                ts_stack_record_summary_cold_4();
                goto LAB_00131c46;
              }
              psVar19 = (short *)*puVar36;
            }
            *(void **)pSVar15 = pvStack_1b0;
            (pSVar15->padding).extent.column = uVar6;
            uVar31 = (ulong)(pSVar15->padding).extent.row;
            uStack_1a0 = (ulong)uVar6;
          }
        }
        uVar22 = (int)uVar31 + 1;
        (pSVar15->padding).extent.row = uVar22;
        uVar24 = *(undefined8 *)(psVar19 + 2);
        *(undefined4 *)((long)pvStack_1b0 + uVar31 * 0x14 + 8) = *(undefined4 *)(psVar19 + 6);
        *(undefined8 *)((long)pvStack_1b0 + uVar31 * 0x14) = uVar24;
        *(uint *)((long)pvStack_1b0 + uVar31 * 0x14 + 0xc) = uVar33;
        *(short *)((long)pvStack_1b0 + uVar31 * 0x14 + 0x10) = sVar2;
        uVar31 = (ulong)uVar22;
        break;
      }
    } while ((uVar22 != uVar33) || (*(short *)((long)pvStack_1b0 + lVar17 + -4) != sVar2));
    uVar30 = (ulong)(ushort)psVar5[0x68];
    if (psVar5[0x68] == 0) goto LAB_00131b5c;
    pbVar28 = (byte *)(psVar5 + 0x1c);
    uVar32 = 0;
    do {
      uVar32 = uVar32 + 1;
      if (uVar32 == uVar30) {
        uVar24 = *(undefined8 *)(psVar5 + 8);
        uVar30 = *(ulong *)(psVar5 + 0xc);
        bVar11 = *(byte *)(psVar5 + 0x10);
        puVar36 = (undefined8 *)((long)(pSVar13[1].node)->links + lVar23 + -0x10);
LAB_00131afe:
        *puVar36 = uVar24;
        if (uVar30 == 0) {
          *(int *)(puVar36 + 3) = *(int *)(puVar36 + 3) + 1;
        }
        else {
          if ((uVar30 & 1) == 0) {
            uVar33 = *(uint *)(uVar30 + 0x2c) >> 2;
          }
          else {
            uVar33 = (uint)(uVar30 >> 3) & 0x1fffffff;
          }
          if (((uVar33 & 1) != 0) ||
             (*(int *)(puVar36 + 3) = *(int *)(puVar36 + 3) + 1, (bVar11 & 1) != 0))
          goto LAB_00131b36;
        }
        *(undefined1 *)((long)puVar36 + 0x1c) = 0;
      }
      else {
        uVar33 = *(uint *)&pSVar13[1].subtrees.contents;
        if (uVar33 < 0x40) {
          uVar24 = *(undefined8 *)(pbVar28 + -0x10);
          uVar30 = *(ulong *)(pbVar28 + -8);
          bVar11 = *pbVar28;
          pSVar20 = pSVar13[1].node;
          puVar36 = (undefined8 *)((long)pSVar20->links + lVar23 + -0x10);
          uVar7 = *puVar36;
          uVar8 = puVar36[1];
          puVar36 = (undefined8 *)((long)pSVar20->links + lVar23);
          uVar9 = *puVar36;
          uVar10 = puVar36[1];
          if (uVar33 == *(uint *)((long)&pSVar13[1].subtrees.contents + 4)) {
            uVar22 = uVar33 * 2;
            if (uVar33 * 2 < 9) {
              uVar22 = 8;
            }
            pSVar20 = (StackNode *)realloc(pSVar20,(ulong)(uVar22 << 5));
            if (pSVar20 == (StackNode *)0x0) {
              ts_stack_record_summary_cold_3();
              goto LAB_00131c13;
            }
            pSVar13[1].node = pSVar20;
            *(uint *)((long)&pSVar13[1].subtrees.contents + 4) = uVar22;
            uVar33 = *(uint *)&pSVar13[1].subtrees.contents;
          }
          *(uint *)&pSVar13[1].subtrees.contents = uVar33 + 1;
          puVar36 = (undefined8 *)((long)pSVar20->links + (ulong)uVar33 * 0x20);
          *puVar36 = uVar9;
          puVar36[1] = uVar10;
          puVar36 = (undefined8 *)((long)pSVar20->links + (ulong)uVar33 * 0x20 + -0x10);
          *puVar36 = uVar7;
          puVar36[1] = uVar8;
          iVar3 = *(int *)&pSVar13[1].subtrees.contents;
          if (iVar3 == 0) {
            __assert_fail("(uint32_t)(&self->iterators)->size - 1 < (&self->iterators)->size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                          ,0x151,
                          "StackSliceArray stack__iter(Stack *, StackVersion, StackCallback, void *, int)"
                         );
          }
          lVar18 = (ulong)(iVar3 - 1) * 0x20;
          puVar36 = (undefined8 *)((long)(pSVar13[1].node)->links + lVar18 + -0x10);
          pSVar29 = (SubtreeArray *)((long)(pSVar13[1].node)->links + lVar18 + -8);
          ts_subtree_array_copy(*pSVar29,pSVar29);
          goto LAB_00131afe;
        }
      }
LAB_00131b36:
      uVar30 = (ulong)(ushort)psVar5[0x68];
      pbVar28 = pbVar28 + 0x18;
    } while (uVar32 < uVar30);
    uVar21 = uVar21 + 1;
  }
  if (uVar26 <= uVar21) {
    uVar26 = *(uint *)&pSVar13[1].subtrees.contents;
    uVar21 = 0;
    if (uVar26 == 0) {
LAB_00131bc8:
      pSVar12 = (Subtree *)pSVar13->node;
      pSVar12[uVar35 * 5 + 2].ptr = pSVar15;
      SVar39._8_8_ = uVar35 * 5;
      SVar39.contents = pSVar12;
      return SVar39;
    }
  }
  goto LAB_00131897;
LAB_00131c46:
  ts_stack_record_summary_cold_6();
LAB_00131c4b:
  __assert_fail("(uint32_t)version < (&self->heads)->size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                ,0x118,
                "StackSliceArray stack__iter(Stack *, StackVersion, StackCallback, void *, int)");
  while( true ) {
    uVar26 = (self->iterators).size;
    uVar35 = 0;
    if (uVar26 == 0) break;
LAB_00130f7e:
    do {
      pSVar13 = (self->iterators).contents + uVar35;
      pSVar29 = &pSVar13->subtrees;
      pSVar20 = pSVar13->node;
      if ((pSVar13->subtrees).size == 0) {
        uVar30 = (ulong)pSVar20->link_count;
        if (pSVar20->link_count == 0) goto LAB_00131232;
        p_Var25 = &pSVar20->links[1].is_pending;
        uVar32 = 0;
        local_40 = uVar31;
        local_38 = uVar35;
        do {
          uVar32 = uVar32 + 1;
          if (uVar32 == uVar30) {
            pSVar16 = pSVar20->links[0].node;
            SVar27 = pSVar20->links[0].subtree;
            local_91 = pSVar20->links[0].is_pending;
            pSVar13 = (self->iterators).contents + uVar35;
LAB_0013113b:
            pSVar13->node = pSVar16;
            if (SVar27.ptr == (SubtreeHeapData *)0x0) {
              pSVar13->subtree_count = pSVar13->subtree_count + 1;
            }
            else {
              uVar21 = (pSVar13->subtrees).size;
              if (uVar21 == (pSVar13->subtrees).capacity) {
                uVar33 = uVar21 * 2;
                if (uVar33 < 9) {
                  uVar33 = 8;
                }
                pSVar12 = (pSVar13->subtrees).contents;
                if (uVar21 < uVar33) {
                  uVar31 = (ulong)uVar33;
                  if (pSVar12 == (Subtree *)0x0) {
                    local_48 = uVar31;
                    pSVar12 = (Subtree *)calloc(uVar31,8);
                    if (pSVar12 == (Subtree *)0x0) goto LAB_00131317;
                  }
                  else {
                    pSVar12 = (Subtree *)realloc(pSVar12,uVar31 << 3);
                    if (pSVar12 == (Subtree *)0x0) {
                      ts_stack_pop_error_cold_3();
LAB_00131317:
                      ts_stack_pop_error_cold_4();
                      goto LAB_00131321;
                    }
                    uVar21 = (pSVar13->subtrees).size;
                  }
                  (pSVar13->subtrees).contents = pSVar12;
                  (pSVar13->subtrees).capacity = uVar33;
                }
              }
              else {
                pSVar12 = (pSVar13->subtrees).contents;
              }
              (pSVar13->subtrees).size = uVar21 + 1;
              pSVar12[uVar21] = SVar27;
              ts_subtree_retain(SVar27);
              if (((ulong)SVar27.ptr & 1) == 0) {
                uVar21 = *(uint *)&(SVar27.ptr)->field_0x2c >> 2;
              }
              else {
                uVar21 = (uint)((ulong)SVar27.ptr >> 3) & 0x1fffffff;
              }
              if (((uVar21 & 1) != 0) ||
                 (pSVar13->subtree_count = pSVar13->subtree_count + 1, (local_91 & 1) != 0))
              goto LAB_0013120b;
            }
            pSVar13->is_pending = false;
          }
          else {
            uVar21 = (self->iterators).size;
            if (uVar21 < 0x40) {
              pSVar16 = ((StackLink *)(p_Var25 + -0x10))->node;
              SVar27 = *(Subtree *)(p_Var25 + -8);
              local_91 = *p_Var25;
              pSVar13 = (self->iterators).contents;
              local_68._0_8_ = pSVar13[uVar35].node;
              local_68._8_8_ = pSVar13[uVar35].subtrees.contents;
              pSVar29 = &pSVar13[uVar35].subtrees;
              local_58._0_4_ = pSVar29->size;
              local_58._4_4_ = pSVar29->capacity;
              uStack_50 = pSVar29[1].contents;
              if (uVar21 == (self->iterators).capacity) {
                uVar21 = uVar21 * 2;
                if (uVar21 < 9) {
                  uVar21 = 8;
                }
                pSVar13 = (StackIterator *)realloc(pSVar13,(ulong)(uVar21 << 5));
                if (pSVar13 == (StackIterator *)0x0) {
                  ts_stack_pop_error_cold_2();
                  goto LAB_001312f0;
                }
                (self->iterators).contents = pSVar13;
                (self->iterators).capacity = uVar21;
                uVar21 = (self->iterators).size;
              }
              (self->iterators).size = uVar21 + 1;
              pSVar29 = &pSVar13[uVar21].subtrees;
              pSVar29->size = (undefined4)local_58;
              pSVar29->capacity = local_58._4_4_;
              pSVar29[1].contents = uStack_50;
              pSVar13[uVar21].node = (StackNode *)local_68._0_8_;
              pSVar13[uVar21].subtrees.contents = (Subtree *)local_68._8_8_;
              uVar34 = (self->iterators).size;
              if (uVar34 == 0) {
                __assert_fail("(uint32_t)(&self->iterators)->size - 1 < (&self->iterators)->size",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                              ,0x151,
                              "StackSliceArray stack__iter(Stack *, StackVersion, StackCallback, void *, int)"
                             );
              }
              uVar21 = uVar34 - 1;
              pSVar14 = (self->iterators).contents;
              pSVar13 = pSVar14 + uVar21;
              pSVar29 = &pSVar14[uVar21].subtrees;
              ts_subtree_array_copy(*pSVar29,pSVar29);
              goto LAB_0013113b;
            }
          }
LAB_0013120b:
          uVar30 = (ulong)pSVar20->link_count;
          p_Var25 = p_Var25 + 0x18;
        } while (uVar32 < uVar30);
        uVar35 = (ulong)((int)local_38 + 1);
        uVar31 = local_40;
      }
      else {
        if ((((uVar31 & 1) == 0) && (((ulong)pSVar29->contents->ptr & 1) == 0)) &&
           (pSVar29->contents->ptr->symbol == 0xffff)) {
          local_68._0_8_ = pSVar29->contents;
          pSVar12 = *(Subtree **)&(pSVar13->subtrees).size;
          local_68._8_4_ = SUB84(pSVar12,0);
          if (1 < (uint)local_68._8_4_) {
            uVar21 = (uint)local_68._8_4_ >> 1;
            uVar30 = 0;
            do {
              local_68._8_4_ = local_68._8_4_ - 1;
              SVar27 = *(Subtree *)(local_68._0_8_ + uVar30 * 8);
              *(Subtree *)(local_68._0_8_ + uVar30 * 8) =
                   *(Subtree *)(local_68._0_8_ + (ulong)(uint)local_68._8_4_ * 8);
              *(Subtree *)(local_68._0_8_ + (ulong)(uint)local_68._8_4_ * 8) = SVar27;
              uVar30 = uVar30 + 1;
            } while (uVar21 != uVar30);
          }
          local_68._8_8_ = pSVar12;
          ts_stack__add_slice(self,version,pSVar20,(SubtreeArray *)local_68);
          uVar31 = CONCAT71((int7)(uVar31 >> 8),1);
        }
        else {
LAB_00131232:
          ts_subtree_array_delete(self->subtree_pool,pSVar29);
        }
        uVar21 = (self->iterators).size;
        if (uVar21 <= (uint)uVar35) {
LAB_001312f0:
          __assert_fail("index < self->size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/array.h"
                        ,0x4f,"void array__erase(VoidArray *, size_t, uint32_t)");
        }
        pSVar13 = (self->iterators).contents;
        memmove(pSVar13 + uVar35,pSVar13 + uVar35 + 1,(ulong)(uVar21 + ~(uint)uVar35) << 5);
        puVar1 = &(self->iterators).size;
        *puVar1 = *puVar1 - 1;
        uVar26 = uVar26 - 1;
      }
    } while ((uint)uVar35 < uVar26);
  }
LAB_00131291:
  uVar34 = (self->slices).size;
  if (uVar34 == 0) {
    pSVar12 = (Subtree *)0x0;
    uVar24 = 0;
  }
  else {
    if (uVar34 != 1) {
LAB_00131345:
      __assert_fail("pop.size == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                    ,0x20c,"SubtreeArray ts_stack_pop_error(Stack *, StackVersion)");
    }
    pSVar4 = (self->slices).contents;
    ts_stack_renumber_version(self,pSVar4->version,version);
    pSVar12 = (pSVar4->subtrees).contents;
    uVar24._0_4_ = (pSVar4->subtrees).size;
    uVar24._4_4_ = (pSVar4->subtrees).capacity;
  }
LAB_00130e9e:
  SVar37.size = (int)uVar24;
  SVar37.capacity = (int)((ulong)uVar24 >> 0x20);
  SVar37.contents = pSVar12;
  return SVar37;
}

Assistant:

SubtreeArray ts_stack_pop_error(Stack *self, StackVersion version) {
  StackNode *node = array_get(&self->heads, version)->node;
  for (unsigned i = 0; i < node->link_count; i++) {
    if (node->links[i].subtree.ptr && ts_subtree_is_error(node->links[i].subtree)) {
      bool found_error = false;
      StackSliceArray pop = stack__iter(self, version, pop_error_callback, &found_error, 1);
      if (pop.size > 0) {
        assert(pop.size == 1);
        ts_stack_renumber_version(self, pop.contents[0].version, version);
        return pop.contents[0].subtrees;
      }
      break;
    }
  }
  return (SubtreeArray){.size = 0};
}